

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O0

void __thiscall QTextTablePrivate::update(QTextTablePrivate *this)

{
  QTextDocumentPrivate *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  QTextFormatCollection *pQVar6;
  QTextFormatCollection *this_01;
  const_reference piVar7;
  FragmentMap *p_00;
  reference pvVar8;
  reference piVar9;
  int iVar10;
  QTextTablePrivate *in_RDI;
  long in_FS_OFFSET;
  int jj;
  int ii;
  int c_1;
  int r;
  int colspan;
  int rowspan;
  int fragment;
  int i;
  int cell;
  QTextFormatCollection *c;
  QTextDocumentPrivate *p;
  QTextTable *q;
  QTextCharFormat fmt;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  qsizetype in_stack_ffffffffffffff58;
  QTextFormatCollection *__n;
  QList<int> *in_stack_ffffffffffffff60;
  QList<int> *__x;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int local_68;
  int local_64;
  ConstIterator local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QTextTable::format((QTextTable *)in_stack_ffffffffffffff60);
  iVar1 = QTextTableFormat::columns
                    ((QTextTableFormat *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in_RDI->nCols = iVar1;
  QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x894abe);
  qVar5 = QList<int>::size(&in_RDI->cells);
  in_RDI->nRows = (int)((qVar5 + in_RDI->nCols + -1) / (long)in_RDI->nCols);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (value_type_conflict4 *)0x894b20);
  this_00 = (in_RDI->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
  pQVar6 = QTextDocumentPrivate::formatCollection(this_00);
  __x = &in_RDI->cellIndices;
  QList<int>::size(&in_RDI->cells);
  QList<int>::resize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_64 = 0;
  local_68 = 0;
  while( true ) {
    this_01 = (QTextFormatCollection *)(long)local_68;
    qVar5 = QList<int>::size(&in_RDI->cells);
    if (qVar5 <= (long)this_01) break;
    piVar7 = QList<int>::at((QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar1 = *piVar7;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    __n = pQVar6;
    p_00 = QTextDocumentPrivate::fragmentMap(this_00);
    QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator(&local_38,p_00,iVar1);
    QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x894c14);
    QTextFormatCollection::charFormat(this_01,(int)((ulong)__n >> 0x20));
    iVar2 = QTextCharFormat::tableCellRowSpan
                      ((QTextCharFormat *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    iVar3 = QTextCharFormat::tableCellColumnSpan
                      ((QTextCharFormat *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    while( true ) {
      in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 & 0xffffff;
      if (local_64 < in_RDI->nRows * in_RDI->nCols) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__n);
        in_stack_ffffffffffffff54 = CONCAT13(*pvVar8 != 0,(int3)in_stack_ffffffffffffff54);
      }
      if ((char)(in_stack_ffffffffffffff54 >> 0x18) == '\0') break;
      local_64 = local_64 + 1;
    }
    iVar4 = local_64 / in_RDI->nCols;
    iVar10 = local_64 % in_RDI->nCols;
    in_stack_ffffffffffffff50 = local_64;
    piVar9 = QList<int>::operator[]
                       ((QList<int> *)CONCAT44(in_stack_ffffffffffffff54,local_64),
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    *piVar9 = in_stack_ffffffffffffff50;
    if (in_RDI->nRows < iVar4 + iVar2) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar10,in_stack_ffffffffffffff80),
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (value_type_conflict4 *)__x);
      in_RDI->nRows = iVar4 + iVar2;
    }
    for (in_stack_ffffffffffffff80 = 0; in_stack_ffffffffffffff80 < iVar2;
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1) {
      for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < iVar3;
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
        in_stack_ffffffffffffff4c = iVar1;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__n);
        *pvVar8 = in_stack_ffffffffffffff4c;
      }
    }
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x894dc8);
    local_68 = local_68 + 1;
  }
  in_RDI->dirty = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextTablePrivate::update() const
{
    Q_Q(const QTextTable);
    nCols = q->format().columns();
    nRows = (cells.size() + nCols-1)/nCols;
//     qDebug(">>>> QTextTablePrivate::update, nRows=%d, nCols=%d", nRows, nCols);

    grid.assign(nRows * nCols, 0);

    QTextDocumentPrivate *p = pieceTable;
    QTextFormatCollection *c = p->formatCollection();

    cellIndices.resize(cells.size());

    int cell = 0;
    for (int i = 0; i < cells.size(); ++i) {
        int fragment = cells.at(i);
        QTextCharFormat fmt = c->charFormat(QTextDocumentPrivate::FragmentIterator(&p->fragmentMap(), fragment)->format);
        int rowspan = fmt.tableCellRowSpan();
        int colspan = fmt.tableCellColumnSpan();

        // skip taken cells
        while (cell < nRows*nCols && grid[cell])
            ++cell;

        int r = cell/nCols;
        int c = cell%nCols;
        cellIndices[i] = cell;

        if (r + rowspan > nRows) {
            grid.resize((r + rowspan) * nCols, 0);
            nRows = r + rowspan;
        }

        Q_ASSERT(c + colspan <= nCols);
        for (int ii = 0; ii < rowspan; ++ii) {
            for (int jj = 0; jj < colspan; ++jj) {
                Q_ASSERT(grid[(r+ii)*nCols + c+jj] == 0);
                grid[(r+ii)*nCols + c+jj] = fragment;
//              qDebug("    setting cell %d span=%d/%d at %d/%d", fragment, rowspan, colspan, r+ii, c+jj);
            }
        }
    }
//     qDebug("<<<< end: nRows=%d, nCols=%d", nRows, nCols);

    dirty = false;
}